

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.c
# Opt level: O0

undo_rec * new_undo_record(void)

{
  undo_rec *puVar1;
  undo_rec *local_10;
  undo_rec *rec;
  
  puVar1 = undo_free.tqh_first;
  local_10 = undo_free.tqh_first;
  if (undo_free.tqh_first == (undo_rec *)0x0) {
    local_10 = (undo_rec *)malloc(0x40);
    if (local_10 == (undo_rec *)0x0) {
      panic("Out of memory in undo code (record)");
    }
  }
  else {
    if (((undo_free.tqh_first)->next).tqe_next == (undo_rec *)0x0) {
      undo_free.tqh_last = ((undo_free.tqh_first)->next).tqe_prev;
    }
    else {
      ((((undo_free.tqh_first)->next).tqe_next)->next).tqe_prev =
           ((undo_free.tqh_first)->next).tqe_prev;
    }
    *(puVar1->next).tqe_prev = (puVar1->next).tqe_next;
    undo_free_num = undo_free_num + -1;
  }
  memset(local_10,0,0x40);
  return local_10;
}

Assistant:

static struct undo_rec *
new_undo_record(void)
{
	struct undo_rec *rec;

	rec = TAILQ_FIRST(&undo_free);
	if (rec != NULL) {
		/* Remove it from the free-list */
		TAILQ_REMOVE(&undo_free, rec, next);
		undo_free_num--;
	} else {
		if ((rec = malloc(sizeof(*rec))) == NULL)
			panic("Out of memory in undo code (record)");
	}
	memset(rec, 0, sizeof(struct undo_rec));

	return (rec);
}